

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O1

int bio_read(BIO *bio,char *buf,int size_)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  
  BIO_clear_retry_flags(bio);
  iVar4 = 0;
  if (bio->init != 0) {
    if ((long *)bio->ptr == (long *)0x0) {
      __assert_fail("b != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x76,"int bio_read(BIO *, char *, int)");
    }
    lVar2 = *bio->ptr;
    if (lVar2 == 0) {
      __assert_fail("b->peer != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x77,"int bio_read(BIO *, char *, int)");
    }
    lVar2 = *(long *)(lVar2 + 0x28);
    if (lVar2 == 0) {
      __assert_fail("peer_b != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x79,"int bio_read(BIO *, char *, int)");
    }
    if (*(long *)(lVar2 + 0x28) == 0) {
      __assert_fail("peer_b->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x7a,"int bio_read(BIO *, char *, int)");
    }
    *(undefined8 *)(lVar2 + 0x30) = 0;
    if (size_ != 0 && buf != (char *)0x0) {
      uVar6 = (ulong)size_;
      uVar7 = *(ulong *)(lVar2 + 0x10);
      if (uVar7 == 0) {
        if (*(int *)(lVar2 + 8) == 0) {
          BIO_set_retry_read(bio);
          if (*(ulong *)(lVar2 + 0x20) < uVar6) {
            uVar6 = *(ulong *)(lVar2 + 0x20);
          }
          *(ulong *)(lVar2 + 0x30) = uVar6;
          iVar4 = -1;
        }
      }
      else {
        if (uVar7 < uVar6) {
          uVar6 = uVar7;
        }
        uVar7 = uVar6;
        if (size_ == 0) {
          __assert_fail("rest > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                        ,0x9a,"int bio_read(BIO *, char *, int)");
        }
        do {
          if (*(ulong *)(lVar2 + 0x10) < uVar7) {
            __assert_fail("rest <= peer_b->len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0x9f,"int bio_read(BIO *, char *, int)");
          }
          lVar3 = *(long *)(lVar2 + 0x18);
          uVar5 = *(ulong *)(lVar2 + 0x20);
          __n = uVar5 - lVar3;
          if (lVar3 + uVar7 <= uVar5) {
            __n = uVar7;
          }
          if (uVar5 < __n + lVar3) {
            __assert_fail("peer_b->offset + chunk <= peer_b->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0xa6,"int bio_read(BIO *, char *, int)");
          }
          if (__n != 0) {
            memcpy(buf,(void *)(lVar3 + *(long *)(lVar2 + 0x28)),__n);
          }
          plVar1 = (long *)(lVar2 + 0x10);
          *plVar1 = *plVar1 - __n;
          if (*plVar1 == 0) {
            if (uVar7 != __n) {
              __assert_fail("chunk == rest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                            ,0xb4,"int bio_read(BIO *, char *, int)");
            }
            *(undefined8 *)(lVar2 + 0x18) = 0;
          }
          else {
            uVar5 = *(long *)(lVar2 + 0x18) + __n;
            *(ulong *)(lVar2 + 0x18) = uVar5;
            if (*(ulong *)(lVar2 + 0x20) < uVar5) {
              __assert_fail("peer_b->offset <= peer_b->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                            ,0xad,"int bio_read(BIO *, char *, int)");
            }
            if (uVar5 == *(ulong *)(lVar2 + 0x20)) {
              *(undefined8 *)(lVar2 + 0x18) = 0;
            }
            buf = buf + __n;
          }
          uVar7 = uVar7 - __n;
        } while (uVar7 != 0);
        iVar4 = (int)uVar6;
      }
    }
  }
  return iVar4;
}

Assistant:

static int bio_read(BIO *bio, char *buf, int size_) {
  size_t size = size_;
  size_t rest;
  struct bio_bio_st *b, *peer_b;

  BIO_clear_retry_flags(bio);

  if (!bio->init) {
    return 0;
  }

  b = reinterpret_cast<bio_bio_st *>(bio->ptr);
  assert(b != NULL);
  assert(b->peer != NULL);
  peer_b = reinterpret_cast<bio_bio_st *>(b->peer->ptr);
  assert(peer_b != NULL);
  assert(peer_b->buf != NULL);

  peer_b->request = 0;  // will be set in "retry_read" situation

  if (buf == NULL || size == 0) {
    return 0;
  }

  if (peer_b->len == 0) {
    if (peer_b->closed) {
      return 0;  // writer has closed, and no data is left
    } else {
      BIO_set_retry_read(bio);  // buffer is empty
      if (size <= peer_b->size) {
        peer_b->request = size;
      } else {
        // don't ask for more than the peer can
        // deliver in one write
        peer_b->request = peer_b->size;
      }
      return -1;
    }
  }

  // we can read
  if (peer_b->len < size) {
    size = peer_b->len;
  }

  // now read "size" bytes
  rest = size;

  assert(rest > 0);
  // one or two iterations
  do {
    size_t chunk;

    assert(rest <= peer_b->len);
    if (peer_b->offset + rest <= peer_b->size) {
      chunk = rest;
    } else {
      // wrap around ring buffer
      chunk = peer_b->size - peer_b->offset;
    }
    assert(peer_b->offset + chunk <= peer_b->size);

    OPENSSL_memcpy(buf, peer_b->buf + peer_b->offset, chunk);

    peer_b->len -= chunk;
    if (peer_b->len) {
      peer_b->offset += chunk;
      assert(peer_b->offset <= peer_b->size);
      if (peer_b->offset == peer_b->size) {
        peer_b->offset = 0;
      }
      buf += chunk;
    } else {
      // buffer now empty, no need to advance "buf"
      assert(chunk == rest);
      peer_b->offset = 0;
    }
    rest -= chunk;
  } while (rest);

  // |size| is bounded by the buffer size, which fits in |int|.
  return (int)size;
}